

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAdapter.cpp
# Opt level: O3

GBAtypeParameters * __thiscall
OpenMD::GayBerneAdapter::getGayBerneParam
          (GBAtypeParameters *__return_storage_ptr__,GayBerneAdapter *this)

{
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  bool bVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_50 [16];
  string local_40;
  
  bVar6 = AtomType::hasProperty(this->at_,(string *)GBtypeID_abi_cxx11_);
  if (!bVar6) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "GayBerneAdapter::getGayBerneParam was passed an atomType (%s)\n\tthat does not appear to be a Gay-Berne atom.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "GayBerneAdapter::getGayBerneParam could not find Gay-Berne\n\tparameters for atomType %s.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) goto LAB_001d91d0;
LAB_001d9210:
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "GayBerneAdapter::getGayBerneParam could not convert\n\tGenericData to GBAtypeData for atom type %s\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    uVar8 = _DAT_00000028;
    uVar9 = uRam000000000000002c;
    uVar10 = uRam0000000000000030;
    uVar11 = uRam0000000000000034;
    uVar12 = _DAT_00000038;
    uVar13 = uRam000000000000003c;
    uVar14 = uRam0000000000000040;
    uVar15 = uRam0000000000000044;
    uVar16 = _DAT_00000048;
    uVar17 = uRam000000000000004c;
    uVar18 = uRam0000000000000050;
    uVar19 = uRam0000000000000054;
  }
  else {
LAB_001d91d0:
    lVar7 = __dynamic_cast(local_50._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::GBAtypeParameters>::typeinfo,0);
    if (lVar7 == 0) goto LAB_001d9210;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
      }
      RVar1 = *(RealType *)(lVar7 + 0x28);
      RVar2 = *(RealType *)(lVar7 + 0x30);
      RVar3 = *(RealType *)(lVar7 + 0x38);
      RVar4 = *(RealType *)(lVar7 + 0x40);
      RVar5 = *(RealType *)(lVar7 + 0x50);
      __return_storage_ptr__->GB_eps_E = *(RealType *)(lVar7 + 0x48);
      __return_storage_ptr__->GB_dw = RVar5;
      __return_storage_ptr__->GB_eps_X = RVar3;
      __return_storage_ptr__->GB_eps_S = RVar4;
      __return_storage_ptr__->GB_d = RVar1;
      __return_storage_ptr__->GB_l = RVar2;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      goto LAB_001d92c2;
    }
    uVar8 = *(undefined4 *)(lVar7 + 0x28);
    uVar9 = *(undefined4 *)(lVar7 + 0x2c);
    uVar10 = *(undefined4 *)(lVar7 + 0x30);
    uVar11 = *(undefined4 *)(lVar7 + 0x34);
    uVar12 = *(undefined4 *)(lVar7 + 0x38);
    uVar13 = *(undefined4 *)(lVar7 + 0x3c);
    uVar14 = *(undefined4 *)(lVar7 + 0x40);
    uVar15 = *(undefined4 *)(lVar7 + 0x44);
    uVar16 = *(undefined4 *)(lVar7 + 0x48);
    uVar17 = *(undefined4 *)(lVar7 + 0x4c);
    uVar18 = *(undefined4 *)(lVar7 + 0x50);
    uVar19 = *(undefined4 *)(lVar7 + 0x54);
  }
  *(undefined4 *)&__return_storage_ptr__->GB_eps_E = uVar16;
  *(undefined4 *)((long)&__return_storage_ptr__->GB_eps_E + 4) = uVar17;
  *(undefined4 *)&__return_storage_ptr__->GB_dw = uVar18;
  *(undefined4 *)((long)&__return_storage_ptr__->GB_dw + 4) = uVar19;
  *(undefined4 *)&__return_storage_ptr__->GB_eps_X = uVar12;
  *(undefined4 *)((long)&__return_storage_ptr__->GB_eps_X + 4) = uVar13;
  *(undefined4 *)&__return_storage_ptr__->GB_eps_S = uVar14;
  *(undefined4 *)((long)&__return_storage_ptr__->GB_eps_S + 4) = uVar15;
  *(undefined4 *)&__return_storage_ptr__->GB_d = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->GB_d + 4) = uVar9;
  *(undefined4 *)&__return_storage_ptr__->GB_l = uVar10;
  *(undefined4 *)((long)&__return_storage_ptr__->GB_l + 4) = uVar11;
LAB_001d92c2:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

GBAtypeParameters GayBerneAdapter::getGayBerneParam() {
    if (!isGayBerne()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GayBerneAdapter::getGayBerneParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Gay-Berne atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(GBtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GayBerneAdapter::getGayBerneParam could not find Gay-Berne\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GBAtypeData> gbData =
        std::dynamic_pointer_cast<GBAtypeData>(data);
    if (gbData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GayBerneAdapter::getGayBerneParam could not convert\n"
               "\tGenericData to GBAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return gbData->getData();
  }